

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Console.cpp
# Opt level: O2

void __thiscall Console::Prompt::Private::moveCursorPosition(Private *this,usize from,ssize x)

{
  ulong uVar1;
  ulong uVar2;
  byte *data;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  char *__format;
  String moveCmd;
  String add;
  String local_70;
  String local_48;
  
  uVar4 = this->stdoutScreenWidth;
  if (uVar4 == 0) {
    __assert_fail("stdoutScreenWidth != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/Console.cpp"
                  ,0x166,"void Console::Prompt::Private::moveCursorPosition(usize, ssize)");
  }
  uVar1 = from / uVar4;
  uVar3 = from % uVar4;
  uVar2 = (x + from) / uVar4;
  uVar4 = (x + from) % uVar4;
  local_70.data = &String::emptyData.super_Data;
  lVar5 = uVar2 - uVar1;
  if (uVar1 <= uVar2) {
    if (uVar1 <= uVar2 && lVar5 != 0) {
      __format = "\x1b[%dB";
      goto LAB_0010614d;
    }
  }
  else {
    lVar5 = uVar1 - uVar2;
    __format = "\x1b[%dA";
LAB_0010614d:
    String::printf(&local_70,__format,lVar5);
  }
  if (uVar4 < uVar3) {
    local_48.data = &String::emptyData.super_Data;
    String::printf(&local_48,"\x1b[%dD",(ulong)(uint)((int)uVar3 - (int)uVar4));
    String::append(&local_70,&local_48);
  }
  else {
    if (uVar4 <= uVar3) goto LAB_001061c2;
    local_48.data = &String::emptyData.super_Data;
    String::printf(&local_48,"\x1b[%dC",(ulong)(uint)((int)uVar4 - (int)uVar3));
    String::append(&local_70,&local_48);
  }
  String::~String(&local_48);
LAB_001061c2:
  if ((local_70.data)->len != 0) {
    data = (byte *)String::operator_cast_to_char_(&local_70);
    Buffer::append(&this->bufferedOutput,data,(local_70.data)->len);
  }
  String::~String(&local_70);
  return;
}

Assistant:

void moveCursorPosition(usize from, ssize x)
  {
#ifdef _MSC_VER
    usize to = from + x;
    usize oldY = from / stdoutScreenWidth;
    usize newY = to / stdoutScreenWidth;
    usize newX = to % stdoutScreenWidth;
    usize cursorX, cursorY;
    getCursorPosition(cursorX, cursorY);
    COORD pos = {(SHORT)newX, (SHORT)(cursorY + ((ssize)newY - (ssize)oldY))};
    VERIFY(SetConsoleCursorPosition(hOriginalStdOut, pos)); // this resets the caret blink timer
#else
    usize to = from + x;
    assert(stdoutScreenWidth != 0);
    usize oldY = from / stdoutScreenWidth;
    usize oldX = from % stdoutScreenWidth;
    usize newY = to / stdoutScreenWidth;
    usize newX = to % stdoutScreenWidth;
    String moveCmd;
    if(newY < oldY)
      moveCmd.printf("\x1b[%dA", (int)(oldY - newY));
    else if(newY > oldY)
      moveCmd.printf("\x1b[%dB", (int)(newY - oldY));
    if(newX < oldX)
    {
      String add;
      add.printf("\x1b[%dD", (int)(oldX - newX));
      moveCmd += add;
    }
    else if(newX > oldX)
    {
      String add;
      add.printf("\x1b[%dC", (int)(newX - oldX));
      moveCmd += add;
    }
    if(!moveCmd.isEmpty())
      writeConsole(moveCmd, moveCmd.length());
#endif
  }